

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void anon_unknown.dwarf_17633d::WriteAttribute(FILE *fp,char *name,char *type,uchar *data,int len)

{
  size_t sVar1;
  size_t sVar2;
  int outLen;
  
  sVar1 = strlen(name);
  sVar1 = fwrite(name,1,sVar1 + 1,(FILE *)fp);
  sVar2 = strlen(name);
  if (sVar1 != sVar2 + 1) {
    __assert_fail("n == strlen(name) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b1a,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sVar1 = strlen(type);
  sVar1 = fwrite(type,1,sVar1 + 1,(FILE *)fp);
  sVar2 = strlen(type);
  if (sVar1 != sVar2 + 1) {
    __assert_fail("n == strlen(type) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b1d,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sVar1 = fwrite(&outLen,1,4,(FILE *)fp);
  if (sVar1 != 4) {
    __assert_fail("n == sizeof(int)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1b24,
                  "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
                 );
  }
  sVar1 = fwrite(data,1,(ulong)(uint)len,(FILE *)fp);
  if (sVar1 == (uint)len) {
    return;
  }
  __assert_fail("n == (size_t)len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                ,0x1b27,
                "void (anonymous namespace)::WriteAttribute(FILE *, const char *, const char *, const unsigned char *, int)"
               );
}

Assistant:

void WriteAttribute(FILE *fp, const char *name, const char *type,
                    const unsigned char *data, int len) {
  size_t n = fwrite(name, 1, strlen(name) + 1, fp);
  assert(n == strlen(name) + 1);

  n = fwrite(type, 1, strlen(type) + 1, fp);
  assert(n == strlen(type) + 1);

  int outLen = len;
  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&outLen));
  }
  n = fwrite(&outLen, 1, sizeof(int), fp);
  assert(n == sizeof(int));

  n = fwrite(data, 1, len, fp);
  assert(n == (size_t)len);

  (void)n;
}